

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::FirstLineOf
          (string *__return_storage_ptr__,java *this,string *value)

{
  pointer pcVar1;
  ulong uVar2;
  string *psVar3;
  undefined8 uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,this,this + (long)&value->_M_dataplus);
  uVar2 = std::__cxx11::string::find((char)__return_storage_ptr__,10);
  if (uVar2 != 0xffffffffffffffff) {
    if (__return_storage_ptr__->_M_string_length < uVar2) {
      uVar4 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",uVar2);
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &__return_storage_ptr__->field_2) {
        operator_delete(pcVar1);
      }
      _Unwind_Resume(uVar4);
    }
    __return_storage_ptr__->_M_string_length = uVar2;
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar2] = '\0';
  }
  psVar3 = (string *)__return_storage_ptr__->_M_string_length;
  if ((psVar3 != (string *)0x0) &&
     (((__return_storage_ptr__->_M_dataplus)._M_p + -1)[(long)psVar3] == '{')) {
    psVar3 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return psVar3;
}

Assistant:

static std::string FirstLineOf(const std::string& value) {
  std::string result = value;

  std::string::size_type pos = result.find_first_of('\n');
  if (pos != std::string::npos) {
    result.erase(pos);
  }

  // If line ends in an opening brace, make it "{ ... }" so it looks nice.
  if (!result.empty() && result[result.size() - 1] == '{') {
    result.append(" ... }");
  }

  return result;
}